

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall IR::IRBuilder::save(IRBuilder *this,Temp *target)

{
  bool bVar1;
  Temp *local_18;
  _Fwd_list_node_base *local_10;
  
  local_18 = target;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Save,std::allocator<IR::Save>>::emplace_front<IR::Temp_const*&>
              ((forward_list<IR::Save,std::allocator<IR::Save>> *)&this->function_->saves_,&local_18
              );
    local_10 = (this->function_->saves_).super__Fwd_list_base<IR::Save,_std::allocator<IR::Save>_>.
               _M_impl._M_head._M_next + 1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
  }
  return;
}

Assistant:

void IRBuilder::save(const Temp* target) {
  if (block_->isTerminated()) return;
  function_->saves_.emplace_front(target);
  block_->push_back(&function_->saves_.front());
}